

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_object_dotget_value(JSON_Object *object,char *name)

{
  char *pcVar1;
  JSON_Value *value;
  JSON_Object *object_00;
  char *dot_position;
  char *name_local;
  JSON_Object *object_local;
  
  pcVar1 = strchr(name,0x2e);
  if (pcVar1 == (char *)0x0) {
    object_local = (JSON_Object *)json_object_get_value(object,name);
  }
  else {
    value = json_object_getn_value(object,name,(long)pcVar1 - (long)name);
    object_00 = json_value_get_object(value);
    object_local = (JSON_Object *)json_object_dotget_value(object_00,pcVar1 + 1);
  }
  return (JSON_Value *)object_local;
}

Assistant:

JSON_Value * json_object_dotget_value(const JSON_Object *object, const char *name) {
    const char *dot_position = strchr(name, '.');
    if (!dot_position) {
        return json_object_get_value(object, name);
    }
    object = json_value_get_object(json_object_getn_value(object, name, dot_position - name));
    return json_object_dotget_value(object, dot_position + 1);
}